

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeTestCases(JUnitTestOutput *this)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  SimpleString local_70;
  SimpleString local_60 [2];
  SimpleString local_40;
  undefined1 local_30 [8];
  SimpleString buf;
  JUnitTestCaseResultNode *cur;
  JUnitTestOutput *this_local;
  
  buf.bufferSize_ = (size_t)(this->impl_->results_).head_;
  while (buf.bufferSize_ != 0) {
    pcVar5 = SimpleString::asCharString(&this->impl_->package_);
    bVar4 = SimpleString::isEmpty(&this->impl_->package_);
    pcVar10 = ".";
    if (bVar4) {
      pcVar10 = "";
    }
    pcVar6 = SimpleString::asCharString(&(this->impl_->results_).group_);
    pcVar7 = SimpleString::asCharString((SimpleString *)buf.bufferSize_);
    iVar1 = *(int *)(buf.bufferSize_ + 0x40);
    sVar3 = (this->impl_->results_).totalCheckCount_;
    uVar2 = *(ulong *)(buf.bufferSize_ + 0x10);
    iVar9 = (int)(uVar2 / 1000);
    pcVar8 = SimpleString::asCharString((SimpleString *)(buf.bufferSize_ + 0x28));
    StringFromFormat((char *)local_30,
                     "<testcase classname=\"%s%s%s\" name=\"%s\" assertions=\"%d\" time=\"%d.%03d\" file=\"%s\" line=\"%d\">\n"
                     ,pcVar5,pcVar10,pcVar6,pcVar7,iVar1 - (int)sVar3,iVar9,
                     (int)uVar2 + iVar9 * -1000,pcVar8,*(undefined4 *)(buf.bufferSize_ + 0x38));
    pcVar5 = SimpleString::asCharString((SimpleString *)local_30);
    SimpleString::SimpleString(&local_40,pcVar5);
    (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_40);
    SimpleString::~SimpleString(&local_40);
    (this->impl_->results_).totalCheckCount_ = *(size_t *)(buf.bufferSize_ + 0x40);
    if (*(long *)(buf.bufferSize_ + 0x18) == 0) {
      if ((*(byte *)(buf.bufferSize_ + 0x20) & 1) != 0) {
        SimpleString::SimpleString(local_60,"<skipped />\n");
        (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,local_60);
        SimpleString::~SimpleString(local_60);
      }
    }
    else {
      (*(this->super_TestOutput)._vptr_TestOutput[0x22])(this,buf.bufferSize_);
    }
    SimpleString::SimpleString(&local_70,"</testcase>\n");
    (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_70);
    SimpleString::~SimpleString(&local_70);
    buf.bufferSize_ = *(size_t *)(buf.bufferSize_ + 0x48);
    SimpleString::~SimpleString((SimpleString *)local_30);
  }
  return;
}

Assistant:

void JUnitTestOutput::writeTestCases()
{
    JUnitTestCaseResultNode* cur = impl_->results_.head_;

    while (cur) {
        SimpleString buf = StringFromFormat(
                "<testcase classname=\"%s%s%s\" name=\"%s\" assertions=\"%d\" time=\"%d.%03d\" file=\"%s\" line=\"%d\">\n",
                impl_->package_.asCharString(),
                impl_->package_.isEmpty() ? "" : ".",
                impl_->results_.group_.asCharString(),
                cur->name_.asCharString(),
                (int) (cur->checkCount_ - impl_->results_.totalCheckCount_),
                (int) (cur->execTime_ / 1000), (int)(cur->execTime_ % 1000),
                cur->file_.asCharString(),
                (int) cur->lineNumber_);
        writeToFile(buf.asCharString());

        impl_->results_.totalCheckCount_ = cur->checkCount_;

        if (cur->failure_) {
            writeFailure(cur);
        }
        else if (cur->ignored_) {
            writeToFile("<skipped />\n");
        }
        writeToFile("</testcase>\n");
        cur = cur->next_;
    }
}